

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::ParseGoogleTestFlagsOnly(int *argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char **in_RDX;
  char **extraout_RDX;
  char **extraout_RDX_00;
  char **extraout_RDX_01;
  char **extraout_RDX_02;
  char **extraout_RDX_03;
  long lVar3;
  undefined8 uVar4;
  int iVar5;
  undefined1 auStack_70 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_50;
  int aiStack_40 [4];
  
  auStack_70._0_8_ = auStack_70 + 0x10;
  auStack_70._8_8_ = 0;
  auStack_70[0x10] = '\0';
  uVar4 = argc;
  if (1 < *argc) {
    iVar5 = 1;
    do {
      StreamableToString<char*>((string *)&aStack_50,(internal *)(argv + iVar5),in_RDX);
      uVar4 = aStack_50._M_allocated_capacity;
      bVar1 = ParseGoogleTestFlag((char *)aStack_50._M_allocated_capacity);
      in_RDX = extraout_RDX;
      if (bVar1) {
LAB_0013cbfa:
        iVar2 = *argc;
        if (iVar2 != iVar5) {
          in_RDX = argv + (long)iVar5 + 1;
          lVar3 = 0;
          do {
            in_RDX[lVar3 + -1] = in_RDX[lVar3];
            lVar3 = lVar3 + 1;
          } while (iVar2 - iVar5 != (int)lVar3);
        }
        *argc = iVar2 + -1;
        iVar5 = iVar5 + -1;
      }
      else {
        bVar1 = ParseFlag<std::__cxx11::string>
                          ((char *)uVar4,"flagfile",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           auStack_70);
        if (bVar1) {
          std::__cxx11::string::_M_assign((string *)&FLAGS_gtest_flagfile_abi_cxx11_);
          LoadFlagsFromFile((string *)auStack_70._0_8_);
          in_RDX = extraout_RDX_00;
          goto LAB_0013cbfa;
        }
        iVar2 = std::__cxx11::string::compare(aStack_50._M_local_buf);
        in_RDX = extraout_RDX_02;
        if ((iVar2 == 0) ||
           (bVar1 = HasGoogleTestFlagPrefix((char *)0x13cc63), in_RDX = extraout_RDX_03, bVar1)) {
          g_help_flag = '\x01';
        }
      }
      uVar4 = aStack_50._M_allocated_capacity;
      if ((int *)aStack_50._M_allocated_capacity != aiStack_40) {
        operator_delete((void *)aStack_50._M_allocated_capacity);
        in_RDX = extraout_RDX_01;
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < *argc);
  }
  if (g_help_flag != '\0') {
    PrintColorEncoded((char *)uVar4);
  }
  if ((string *)auStack_70._0_8_ != (string *)(auStack_70 + 0x10)) {
    operator_delete((void *)auStack_70._0_8_);
  }
  return;
}

Assistant:

void ParseGoogleTestFlagsOnly(int* argc, char** argv) {
#if GTEST_HAS_ABSL
  if (*argc > 0) {
    // absl::ParseCommandLine() requires *argc > 0.
    auto positional_args = absl::flags_internal::ParseCommandLineImpl(
        *argc, argv, absl::flags_internal::ArgvListAction::kRemoveParsedArgs,
        absl::flags_internal::UsageFlagsAction::kHandleUsage,
        absl::flags_internal::OnUndefinedFlag::kReportUndefined);
    // Any command-line positional arguments not part of any command-line flag
    // (or arguments to a flag) are copied back out to argv, with the program
    // invocation name at position 0, and argc is resized. This includes
    // positional arguments after the flag-terminating delimiter '--'.
    // See https://abseil.io/docs/cpp/guides/flags.
    std::copy(positional_args.begin(), positional_args.end(), argv);
    if (static_cast<int>(positional_args.size()) < *argc) {
      argv[positional_args.size()] = nullptr;
      *argc = static_cast<int>(positional_args.size());
    }
  }
#else
  ParseGoogleTestFlagsOnlyImpl(argc, argv);
#endif

  // Fix the value of *_NSGetArgc() on macOS, but if and only if
  // *_NSGetArgv() == argv
  // Only applicable to char** version of argv
#if GTEST_OS_MAC
#ifndef GTEST_OS_IOS
  if (*_NSGetArgv() == argv) {
    *_NSGetArgc() = *argc;
  }
#endif
#endif
}